

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkAigToLogicSop(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  int *pfCompl;
  ulong uVar9;
  Abc_Ntk_t *pAVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNetlist.c"
                  ,0x104,"Abc_Ntk_t *Abc_NtkAigToLogicSop(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar5 = Abc_AigConst1(pNtk);
  if (0 < (pAVar5->vFanouts).nSize) {
    pAVar6 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pAVar5->field_6).pCopy = pAVar6;
  }
  for (iVar11 = 0; iVar4 = pNtk->vObjs->nSize, iVar11 < iVar4; iVar11 = iVar11 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,iVar11);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
      Abc_NtkDupObj(pNtk_00,pAVar5,0);
      pcVar7 = Abc_SopCreateAnd2((Mem_Flex_t *)pNtk_00->pManFunc,
                                 *(uint *)&pAVar5->field_0x14 >> 10 & 1,
                                 *(uint *)&pAVar5->field_0x14 >> 0xb & 1);
      (((pAVar5->field_6).pCopy)->field_5).pData = pcVar7;
    }
  }
  iVar11 = 0;
  bVar3 = false;
  do {
    if (iVar4 <= iVar11) {
      for (iVar11 = 0; iVar11 < iVar4; iVar11 = iVar11 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar11);
        if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
          for (lVar14 = 0; lVar14 < (pAVar5->vFanins).nSize; lVar14 = lVar14 + 1) {
            pAVar6 = *(Abc_Obj_t **)
                      ((long)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar14]] + 0x40);
            pAVar8 = (pAVar6->field_6).pCopy;
            if (pAVar8 == (Abc_Obj_t *)0x0) {
              pAVar8 = pAVar6;
            }
            Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar8);
          }
        }
        iVar4 = pNtk->vObjs->nSize;
      }
      for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iVar11);
        uVar9 = *(ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40);
        uVar12 = *(ulong *)(uVar9 + 0x40);
        if (uVar12 == 0) {
          uVar12 = uVar9;
        }
        Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                        (Abc_Obj_t *)(uVar12 ^ *(uint *)&pAVar5->field_0x14 >> 10 & 1));
      }
      if (bVar3) {
        Abc_NtkLogicMakeSimpleCos2(pNtk_00,0);
      }
      else {
        Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      }
      pAVar10 = pNtk->pExdc;
      if (pAVar10 != (Abc_Ntk_t *)0x0) {
        if (pAVar10->ntkType == ABC_NTK_STRASH) {
          pAVar10 = Abc_NtkAigToLogicSop(pAVar10);
        }
        else {
          pAVar10 = Abc_NtkDup(pAVar10);
        }
        pNtk_00->pExdc = pAVar10;
      }
      iVar11 = Abc_NtkCheck(pNtk_00);
      if (iVar11 == 0) {
        fwrite("Abc_NtkAigToLogicSop(): Network check has failed.\n",0x32,1,_stdout);
      }
      return pNtk_00;
    }
    pAVar5 = Abc_NtkObj(pNtk,iVar11);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
      if (((ulong)pAVar5 & 1) != 0) {
        pcVar7 = "!Abc_ObjIsComplement(pNode)";
LAB_006c14b6:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (pAVar5->pNtk->ntkType != ABC_NTK_STRASH) {
        pcVar7 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_006c14b6;
      }
      if (((pAVar5->field_5).pData != (void *)0x0) && (0 < (pAVar5->vFanouts).nSize)) {
        pAVar8 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        pfCompl = (int *)malloc(0x40);
        uVar13 = 0;
        uVar12 = 0;
        uVar9 = 0x10;
        for (pAVar6 = pAVar5; pAVar6 != (Abc_Obj_t *)0x0;
            pAVar6 = (Abc_Obj_t *)(pAVar6->field_5).pData) {
          uVar1 = *(uint *)&pAVar6->field_0x14;
          uVar2 = *(uint *)&pAVar5->field_0x14;
          iVar4 = (int)uVar13;
          if (uVar12 == uVar9) {
            if (uVar12 < 0x10) {
              uVar13 = 0x10;
            }
            if ((int)uVar9 < (int)uVar13) {
              if (pfCompl == (int *)0x0) {
                pfCompl = (int *)malloc(uVar13 << 2);
              }
              else {
                pfCompl = (int *)realloc(pfCompl,uVar13 << 2);
              }
              uVar9 = uVar13;
              if (pfCompl == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
            }
          }
          pfCompl[uVar12] = (uVar1 ^ uVar2) >> 7 & 1;
          uVar12 = uVar12 + 1;
          Abc_ObjAddFanin(pAVar8,(pAVar6->field_6).pCopy);
          uVar13 = (ulong)(iVar4 + 2);
        }
        pcVar7 = Abc_SopCreateOrMultiCube((Mem_Flex_t *)pNtk_00->pManFunc,(int)uVar12,pfCompl);
        (pAVar8->field_5).pData = pcVar7;
        *(Abc_Obj_t **)((long)(pAVar5->field_6).pTemp + 0x40) = pAVar8;
        free(pfCompl);
        bVar3 = true;
      }
    }
    iVar11 = iVar11 + 1;
    iVar4 = pNtk->vObjs->nSize;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSop( Abc_Ntk_t * pNtk )
{
    extern int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate );

    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeNew;
    Vec_Int_t * vInts;
    int i, k, fChoices = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // if the constant node is used, duplicate it
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    // duplicate the nodes and create node functions
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        pObj->pCopy->pData = Abc_SopCreateAnd2( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    }
    // create the choice nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;
        // create an OR gate
        pNodeNew = Abc_NtkCreateNode(pNtkNew);
        // add fanins
        vInts = Vec_IntAlloc( 10 );
        for ( pFanin = pObj; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            Vec_IntPush( vInts, (int)(pObj->fPhase != pFanin->fPhase) );
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // create the logic function
        pNodeNew->pData = Abc_SopCreateOrMultiCube( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_IntSize(vInts), Vec_IntArray(vInts) );
        // set the new node
        pObj->pCopy->pCopy = pNodeNew;
        Vec_IntFree( vInts );
        fChoices = 1;
    }
    // connect the internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->pCopy->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // connect the COs
//    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin->pCopy->pCopy )
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy->pCopy, Abc_ObjFaninC0(pObj));
        else
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }

    // fix the problem with complemented and duplicated CO edges
    if ( fChoices )
        Abc_NtkLogicMakeSimpleCos2( pNtkNew, 0 );
    else
        Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
    {
        if ( Abc_NtkIsStrash(pNtk->pExdc) )
            pNtkNew->pExdc = Abc_NtkAigToLogicSop( pNtk->pExdc );
        else
            pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAigToLogicSop(): Network check has failed.\n" );
    return pNtkNew;
}